

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

aiBone * __thiscall
Assimp::Ogre::Bone::ConvertToAssimpBone
          (Bone *this,Skeleton *param_1,
          vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *boneWeights)

{
  undefined1 auVar1 [16];
  bool bVar2;
  aiBone *this_00;
  size_type sVar3;
  ulong uVar4;
  aiVertexWeight *paVar5;
  const_reference __src;
  aiVertexWeight *local_50;
  aiBone *bone;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *boneWeights_local;
  Skeleton *param_1_local;
  Bone *this_local;
  
  this_00 = (aiBone *)operator_new(0x450);
  aiBone::aiBone(this_00);
  aiString::operator=((aiString *)this_00,&this->name);
  memcpy(&this_00->mOffsetMatrix,&this->worldMatrix,0x40);
  bVar2 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::empty(boneWeights);
  if (!bVar2) {
    sVar3 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::size(boneWeights);
    this_00->mNumWeights = (uint)sVar3;
    sVar3 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::size(boneWeights);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    paVar5 = (aiVertexWeight *)operator_new__(uVar4);
    if (sVar3 != 0) {
      local_50 = paVar5;
      do {
        aiVertexWeight::aiVertexWeight(local_50);
        local_50 = local_50 + 1;
      } while (local_50 != paVar5 + sVar3);
    }
    this_00->mWeights = paVar5;
    paVar5 = this_00->mWeights;
    __src = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::operator[](boneWeights,0);
    sVar3 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::size(boneWeights);
    memcpy(paVar5,__src,sVar3 << 3);
  }
  return this_00;
}

Assistant:

aiBone *Bone::ConvertToAssimpBone(Skeleton * /*parent*/, const std::vector<aiVertexWeight> &boneWeights)
{
    aiBone *bone = new aiBone();
    bone->mName = name;
    bone->mOffsetMatrix = worldMatrix;

    if (!boneWeights.empty())
    {
        bone->mNumWeights = static_cast<unsigned int>(boneWeights.size());
        bone->mWeights = new aiVertexWeight[boneWeights.size()];
        memcpy(bone->mWeights, &boneWeights[0], boneWeights.size() * sizeof(aiVertexWeight));
    }

    return bone;
}